

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.h
# Opt level: O0

string * __thiscall
cmGlobalGhsMultiGenerator::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGhsMultiGenerator *this)

{
  cmGlobalGhsMultiGenerator *this_local;
  
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string GetName() const override { return GetActualName(); }